

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_simulate.c
# Opt level: O0

lowmc_simulate_online_f lowmc_simulate_online_get_implementation(lowmc_parameters_t *lowmc)

{
  uint32_t uVar1;
  lowmc_parameters_t *in_RDI;
  uint32_t lowmc_id;
  lowmc_simulate_online_f local_8;
  
  uVar1 = lowmc_get_id(in_RDI);
  if (((DAT_0022510c & 0x400) == 0x400) && ((DAT_0022510c & 0x20000) == 0x20000)) {
    if (uVar1 == 0x81002b) {
      local_8 = lowmc_simulate_online_s256_129_43;
      return local_8;
    }
    if (uVar1 == 0xc00040) {
      local_8 = lowmc_simulate_online_s256_192_64;
      return local_8;
    }
    if (uVar1 == 0xff0055) {
      local_8 = lowmc_simulate_online_s256_255_85;
      return local_8;
    }
  }
  if (uVar1 == 0x81002b) {
    local_8 = lowmc_simulate_online_s128_129_43;
  }
  else if (uVar1 == 0xc00040) {
    local_8 = lowmc_simulate_online_s128_192_64;
  }
  else {
    local_8 = lowmc_simulate_online_s128_255_85;
  }
  return local_8;
}

Assistant:

lowmc_simulate_online_f lowmc_simulate_online_get_implementation(const lowmc_parameters_t* lowmc) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);

#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      return lowmc_simulate_online_s256_129_43;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      return lowmc_simulate_online_s256_192_64;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      return lowmc_simulate_online_s256_255_85;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      return lowmc_simulate_online_s128_129_43;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      return lowmc_simulate_online_s128_192_64;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      return lowmc_simulate_online_s128_255_85;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  switch (lowmc_id) {
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    return lowmc_simulate_online_uint64_129_43;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    return lowmc_simulate_online_uint64_192_64;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    return lowmc_simulate_online_uint64_255_85;
#endif
  }
#endif

  UNREACHABLE;
  return NULL;
}